

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall helics::apps::Recorder::generateInterfaces(Recorder *this)

{
  string_view endpoint;
  bool bVar1;
  reference ppVar2;
  _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
  *in_RDI;
  Recorder *unaff_retaddr;
  string_view in_stack_00000008;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int> *ept;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *__range2_1;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int> *tag;
  iterator __end2;
  iterator __begin2;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *__range2;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_ffffffffffffff88;
  _Self local_50;
  _Self local_48;
  _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
  *local_40;
  size_t local_38;
  char *local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  Recorder *this_00;
  _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
  *p_Var3;
  
  this_00 = (Recorder *)(in_RDI + 0x3b);
  p_Var3 = in_RDI;
  local_18._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::begin(in_stack_ffffffffffffff88);
  local_20._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = CLI::std::operator==(&local_18,&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_28 = CLI::std::
               _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                            *)0x3f5d5d);
    if (local_28->second == -1) {
      local_38 = (local_28->first)._M_len;
      local_30 = (local_28->first)._M_str;
      addSubscription(unaff_retaddr,in_stack_00000008);
    }
    CLI::std::
    _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
    ::operator++(in_RDI);
  }
  local_40 = in_RDI + 0x47;
  local_48._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::begin(in_stack_ffffffffffffff88);
  local_50._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = CLI::std::operator==(&local_48,&local_50);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppVar2 = CLI::std::
             _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                          *)0x3f5df4);
    if (ppVar2->second == -1) {
      endpoint._M_str = (char *)unaff_retaddr;
      endpoint._M_len = (size_t)p_Var3;
      addEndpoint(this_00,endpoint);
    }
    CLI::std::
    _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
    ::operator++(in_RDI);
  }
  loadCaptureInterfaces(this);
  return;
}

Assistant:

void Recorder::generateInterfaces()
{
    for (auto& tag : subkeys) {
        if (tag.second == -1) {
            addSubscription(tag.first);
        }
    }
    for (auto& ept : eptNames) {
        if (ept.second == -1) {
            addEndpoint(ept.first);
        }
    }
    loadCaptureInterfaces();
}